

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O1

void wiz_hack_map_query_square_flag(chunk *c,void *closure,loc grid,_Bool *show,uint8_t *color)

{
  int flag;
  _Bool _Var1;
  square *psVar2;
  uint8_t uVar3;
  
  flag = *closure;
  if (flag == 0) {
    _Var1 = square_isknown((chunk_conflict *)c,grid);
  }
  else {
    psVar2 = square((chunk_conflict *)c,grid);
    _Var1 = flag_has_dbg(psVar2->info,3,flag,"square(c, grid)->info","flag");
  }
  if (_Var1 == false) {
    *show = false;
  }
  else {
    *show = true;
    _Var1 = square_ispassable((chunk_conflict *)c,grid);
    uVar3 = '\x04';
    if (_Var1) {
      uVar3 = '\v';
    }
    *color = uVar3;
  }
  return;
}

Assistant:

static void wiz_hack_map_query_square_flag(struct chunk *c, void *closure,
	struct loc grid, bool *show, uint8_t *color)
{
	int flag = *((int*)closure);

	/* With a flag, test for that.  Otherwise, test if grid is known. */
	if ((flag && sqinfo_has(square(c, grid)->info, flag)) ||
			(!flag && square_isknown(c, grid))) {
		*show = true;
		*color = (square_ispassable(c, grid)) ?
			COLOUR_YELLOW : COLOUR_RED;
	} else {
		*show = false;
	}
}